

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

void __thiscall
ear::Layout::checkPositions
          (Layout *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *callback)

{
  pointer pCVar1;
  pointer this_00;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_40;
  
  pCVar1 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (this_00 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1)
  {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_40,callback);
    Channel::checkPosition(this_00,&local_40);
    std::_Function_base::~_Function_base(&local_40.super__Function_base);
  }
  return;
}

Assistant:

void Layout::checkPositions(
      std::function<void(const std::string&)> callback) const {
    for (const auto& channel : _channels) {
      channel.checkPosition(callback);
    }
  }